

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O2

void sse_merge(__m128i *vInput1,__m128i *vInput2,__m128i *vecMin,__m128i *vecMax)

{
  __m128i alVar1;
  undefined1 auVar2 [16];
  
  auVar2 = vpminuw_avx((undefined1  [16])*vInput1,(undefined1  [16])*vInput2);
  alVar1 = (__m128i)vpmaxuw_avx((undefined1  [16])*vInput1,(undefined1  [16])*vInput2);
  *vecMax = alVar1;
  auVar2 = vpalignr_avx(auVar2,auVar2,2);
  alVar1 = (__m128i)vpminuw_avx(auVar2,(undefined1  [16])alVar1);
  *vecMin = alVar1;
  alVar1 = (__m128i)vpmaxuw_avx(auVar2,(undefined1  [16])*vecMax);
  *vecMax = alVar1;
  auVar2 = vpalignr_avx((undefined1  [16])*vecMin,(undefined1  [16])*vecMin,2);
  alVar1 = (__m128i)vpminuw_avx(auVar2,(undefined1  [16])alVar1);
  *vecMin = alVar1;
  alVar1 = (__m128i)vpmaxuw_avx(auVar2,(undefined1  [16])*vecMax);
  *vecMax = alVar1;
  auVar2 = vpalignr_avx((undefined1  [16])*vecMin,(undefined1  [16])*vecMin,2);
  alVar1 = (__m128i)vpminuw_avx(auVar2,(undefined1  [16])alVar1);
  *vecMin = alVar1;
  alVar1 = (__m128i)vpmaxuw_avx(auVar2,(undefined1  [16])*vecMax);
  *vecMax = alVar1;
  auVar2 = vpalignr_avx((undefined1  [16])*vecMin,(undefined1  [16])*vecMin,2);
  alVar1 = (__m128i)vpminuw_avx(auVar2,(undefined1  [16])alVar1);
  *vecMin = alVar1;
  alVar1 = (__m128i)vpmaxuw_avx(auVar2,(undefined1  [16])*vecMax);
  *vecMax = alVar1;
  auVar2 = vpalignr_avx((undefined1  [16])*vecMin,(undefined1  [16])*vecMin,2);
  alVar1 = (__m128i)vpminuw_avx(auVar2,(undefined1  [16])alVar1);
  *vecMin = alVar1;
  alVar1 = (__m128i)vpmaxuw_avx(auVar2,(undefined1  [16])*vecMax);
  *vecMax = alVar1;
  auVar2 = vpalignr_avx((undefined1  [16])*vecMin,(undefined1  [16])*vecMin,2);
  alVar1 = (__m128i)vpminuw_avx(auVar2,(undefined1  [16])alVar1);
  *vecMin = alVar1;
  alVar1 = (__m128i)vpmaxuw_avx(auVar2,(undefined1  [16])*vecMax);
  *vecMax = alVar1;
  auVar2 = vpalignr_avx((undefined1  [16])*vecMin,(undefined1  [16])*vecMin,2);
  alVar1 = (__m128i)vpminuw_avx(auVar2,(undefined1  [16])alVar1);
  *vecMin = alVar1;
  alVar1 = (__m128i)vpmaxuw_avx(auVar2,(undefined1  [16])*vecMax);
  *vecMax = alVar1;
  alVar1 = (__m128i)vpalignr_avx((undefined1  [16])*vecMin,(undefined1  [16])*vecMin,2);
  *vecMin = alVar1;
  return;
}

Assistant:

CROARING_TARGET_AVX2

// Assuming that vInput1 and vInput2 are sorted, produces a sorted output going
// from vecMin all the way to vecMax
// developed originally for merge sort using SIMD instructions.
// Standard merge. See, e.g., Inoue and Taura, SIMD- and Cache-Friendly
// Algorithm for Sorting an Array of Structures
static inline void sse_merge(const __m128i *vInput1,
                             const __m128i *vInput2,              // input 1 & 2
                             __m128i *vecMin, __m128i *vecMax) {  // output
    __m128i vecTmp;
    vecTmp = _mm_min_epu16(*vInput1, *vInput2);
    *vecMax = _mm_max_epu16(*vInput1, *vInput2);
    vecTmp = _mm_alignr_epi8(vecTmp, vecTmp, 2);
    *vecMin = _mm_min_epu16(vecTmp, *vecMax);
    *vecMax = _mm_max_epu16(vecTmp, *vecMax);
    vecTmp = _mm_alignr_epi8(*vecMin, *vecMin, 2);
    *vecMin = _mm_min_epu16(vecTmp, *vecMax);
    *vecMax = _mm_max_epu16(vecTmp, *vecMax);
    vecTmp = _mm_alignr_epi8(*vecMin, *vecMin, 2);
    *vecMin = _mm_min_epu16(vecTmp, *vecMax);
    *vecMax = _mm_max_epu16(vecTmp, *vecMax);
    vecTmp = _mm_alignr_epi8(*vecMin, *vecMin, 2);
    *vecMin = _mm_min_epu16(vecTmp, *vecMax);
    *vecMax = _mm_max_epu16(vecTmp, *vecMax);
    vecTmp = _mm_alignr_epi8(*vecMin, *vecMin, 2);
    *vecMin = _mm_min_epu16(vecTmp, *vecMax);
    *vecMax = _mm_max_epu16(vecTmp, *vecMax);
    vecTmp = _mm_alignr_epi8(*vecMin, *vecMin, 2);
    *vecMin = _mm_min_epu16(vecTmp, *vecMax);
    *vecMax = _mm_max_epu16(vecTmp, *vecMax);
    vecTmp = _mm_alignr_epi8(*vecMin, *vecMin, 2);
    *vecMin = _mm_min_epu16(vecTmp, *vecMax);
    *vecMax = _mm_max_epu16(vecTmp, *vecMax);
    *vecMin = _mm_alignr_epi8(*vecMin, *vecMin, 2);
}